

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  char cVar4;
  int iVar5;
  ImGuiID IVar6;
  ImGuiWindow *pIVar7;
  ImGuiGroupData *pIVar8;
  ulong uVar9;
  bool bVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  char cVar13;
  ImGuiWindow *window;
  ImGuiID IVar14;
  ImGuiContext *g;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  ImRect local_38;
  ImVec2 local_28;
  
  pIVar11 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  iVar5 = (GImGui->GroupStack).Size;
  pIVar8 = (GImGui->GroupStack).Data;
  if ((pIVar7->DC).IsSetPos == false) {
    IVar2 = (pIVar7->DC).CursorMaxPos;
  }
  else {
    (pIVar7->DC).IsSetPos = false;
    IVar2 = (pIVar7->DC).CursorPos;
    fVar20 = IVar2.x;
    fVar18 = IVar2.y;
    IVar2 = (pIVar7->DC).CursorMaxPos;
    fVar19 = IVar2.x;
    fVar21 = IVar2.y;
    uVar16 = -(uint)(fVar20 <= fVar19);
    uVar17 = -(uint)(fVar18 <= fVar21);
    IVar2 = (ImVec2)(CONCAT44(~uVar17 & (uint)fVar18,~uVar16 & (uint)fVar20) |
                    CONCAT44((uint)fVar21 & uVar17,(uint)fVar19 & uVar16));
    (pIVar7->DC).CursorMaxPos = IVar2;
  }
  local_38.Min = pIVar8[(long)iVar5 + -1].BackupCursorPos;
  IVar3 = (pIVar11->LastItemData).Rect.Max;
  fVar20 = IVar3.x;
  fVar18 = IVar3.y;
  uVar16 = -(uint)(fVar20 <= IVar2.x);
  uVar17 = -(uint)(fVar18 <= IVar2.y);
  uVar9 = CONCAT44(~uVar17 & (uint)fVar18,~uVar16 & (uint)fVar20) |
          CONCAT44((uint)IVar2.y & uVar17,(uint)IVar2.x & uVar16);
  fVar20 = pIVar8[(long)iVar5 + -1].BackupCursorPos.x;
  fVar18 = pIVar8[(long)iVar5 + -1].BackupCursorPos.y;
  fVar19 = (float)uVar9;
  fVar21 = (float)(uVar9 >> 0x20);
  uVar16 = -(uint)(fVar20 <= fVar19);
  uVar17 = -(uint)(fVar18 <= fVar21);
  local_38.Max = (ImVec2)(CONCAT44(~uVar17 & (uint)fVar18,~uVar16 & (uint)fVar20) |
                         CONCAT44((uint)fVar21 & uVar17,(uint)fVar19 & uVar16));
  (pIVar7->DC).CursorPos = local_38.Min;
  (pIVar7->DC).CursorPosPrevLine = pIVar8[(long)iVar5 + -1].BackupCursorPosPrevLine;
  fVar20 = pIVar8[(long)iVar5 + -1].BackupCursorMaxPos.x;
  fVar21 = pIVar8[(long)iVar5 + -1].BackupCursorMaxPos.y;
  fVar18 = local_38.Max.x;
  fVar19 = local_38.Max.y;
  uVar16 = -(uint)(fVar18 <= fVar20);
  uVar17 = -(uint)(fVar19 <= fVar21);
  (pIVar7->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar17 & (uint)fVar19,~uVar16 & (uint)fVar18) |
               CONCAT44((uint)fVar21 & uVar17,(uint)fVar20 & uVar16));
  (pIVar7->DC).Indent.x = pIVar8[(long)iVar5 + -1].BackupIndent.x;
  (pIVar7->DC).GroupOffset.x = pIVar8[(long)iVar5 + -1].BackupGroupOffset.x;
  (pIVar7->DC).CurrLineSize = pIVar8[(long)iVar5 + -1].BackupCurrLineSize;
  fVar20 = pIVar8[(long)iVar5 + -1].BackupCurrLineTextBaseOffset;
  (pIVar7->DC).CurrLineTextBaseOffset = fVar20;
  (pIVar7->DC).IsSameLine = pIVar8[(long)iVar5 + -1].BackupIsSameLine;
  if (pIVar11->LogEnabled == true) {
    pIVar11->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar8[(long)iVar5 + -1].EmitItem == false) {
    (pIVar11->GroupStack).Size = (pIVar11->GroupStack).Size + -1;
    return;
  }
  fVar21 = (pIVar7->DC).PrevLineTextBaseOffset;
  uVar16 = -(uint)(fVar20 <= fVar21);
  (pIVar7->DC).CurrLineTextBaseOffset = (float)(~uVar16 & (uint)fVar20 | (uint)fVar21 & uVar16);
  local_28.x = fVar18 - local_38.Min.x;
  local_28.y = fVar19 - local_38.Min.y;
  ItemSize(&local_28,-1.0);
  ItemAdd(&local_38,0,(ImRect *)0x0,1);
  IVar6 = pIVar11->ActiveId;
  if (pIVar8[(long)iVar5 + -1].BackupActiveIdIsAlive == IVar6) {
    if (pIVar8[(long)iVar5 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar4 = pIVar11->ActiveIdPreviousFrameIsAlive;
joined_r0x0018c908:
      if (cVar4 != '\0') {
        IVar14 = pIVar11->ActiveIdPreviousFrame;
        cVar4 = '\x01';
        bVar12 = false;
        goto LAB_0018c8fb;
      }
    }
    bVar10 = false;
    cVar13 = '\0';
  }
  else {
    bVar15 = pIVar11->ActiveIdIsAlive != IVar6;
    IVar14 = IVar6;
    if (pIVar8[(long)iVar5 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar4 = pIVar11->ActiveIdPreviousFrameIsAlive;
      bVar12 = true;
      if (IVar6 == 0 || bVar15) goto joined_r0x0018c908;
    }
    else {
      cVar13 = '\0';
      bVar10 = false;
      cVar4 = '\0';
      bVar12 = true;
      if (IVar6 == 0 || bVar15) goto LAB_0018c90e;
    }
LAB_0018c8fb:
    bVar10 = bVar12;
    cVar13 = cVar4;
    (pIVar11->LastItemData).ID = IVar14;
  }
LAB_0018c90e:
  (pIVar11->LastItemData).Rect.Min = local_38.Min;
  (pIVar11->LastItemData).Rect.Max = local_38.Max;
  if ((pIVar8[(long)iVar5 + -1].BackupHoveredIdIsAlive == false) && (pIVar11->HoveredId != 0)) {
    pIVar1 = &(pIVar11->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar10) && (pIVar11->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar11->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar16 = (pIVar11->LastItemData).StatusFlags;
  (pIVar11->LastItemData).StatusFlags = uVar16 | 0x20;
  if ((cVar13 != '\0') && (IVar6 != pIVar11->ActiveIdPreviousFrame)) {
    (pIVar11->LastItemData).StatusFlags = uVar16 | 0x60;
  }
  (pIVar11->GroupStack).Size = (pIVar11->GroupStack).Size + -1;
  if (pIVar11->DebugShowGroupRects == true) {
    ImDrawList::AddRect(pIVar7->DrawList,&local_38.Min,&local_38.Max,0xffff00ff,0.0,0,1.0);
  }
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    // Include LastItemData.Rect.Max as a workaround for e.g. EndTable() undershooting with CursorMaxPos report. (#7543)
    ImRect group_bb(group_data.BackupCursorPos, ImMax(ImMax(window->DC.CursorMaxPos, g.LastItemData.Rect.Max), group_data.BackupCursorPos));
    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorPosPrevLine = group_data.BackupCursorPosPrevLine;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, group_bb.Max);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    window->DC.IsSameLine = group_data.BackupIsSameLine;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset); // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    if (g.DebugShowGroupRects)
        window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}